

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

long __thiscall Arcflow::go(Arcflow *this)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *this_00;
  int it;
  pointer piVar1;
  pointer pIVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  iterator iVar7;
  int *piVar8;
  uint *puVar9;
  runtime_error *this_01;
  int d_1;
  ulong uVar10;
  int iVar11;
  int iVar12;
  vector<int,_std::allocator<int>_> *in_RSI;
  long lVar13;
  pointer pvVar14;
  int iVar15;
  int local_20c;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> sv;
  vector<int,_std::allocator<int>_> valid_opts;
  vector<int,_std::allocator<int>_> key;
  vector<int,_std::allocator<int>_> maxw;
  _Vector_base<int,_std::allocator<int>_> local_178;
  _Vector_base<int,_std::allocator<int>_> local_160;
  Arc local_144;
  char _error_msg_ [256];
  
  lVar6 = (long)(this->inst).ndims;
  piVar1 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar12 = 0;
  if ((this->inst).binary == false) {
    iVar12 = piVar1[lVar6 + 1];
  }
  it = piVar1[lVar6];
  valid_opts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  valid_opts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  valid_opts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&mu,&this->max_label);
  _error_msg_[0] = '\0';
  _error_msg_[1] = '\0';
  _error_msg_[2] = '\0';
  _error_msg_[3] = '\0';
  std::vector<int,_std::allocator<int>_>::vector
            (&maxw,(long)(this->inst).ndims,(value_type *)_error_msg_,(allocator_type *)&key);
  for (iVar11 = 0; _error_msg_._0_4_ = iVar11, iVar11 < (this->inst).nbtypes; iVar11 = iVar11 + 1) {
    bVar4 = is_valid(this,in_RSI,
                     (this->inst).Ws.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar11);
    if (bVar4) {
      std::vector<int,_std::allocator<int>_>::push_back(&valid_opts,(value_type *)_error_msg_);
      pvVar14 = (this->inst).Ws.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar6 = 0; iVar11 = _error_msg_._0_4_, lVar6 < (this->inst).ndims; lVar6 = lVar6 + 1) {
        iVar11 = *(int *)(*(long *)&pvVar14[(int)_error_msg_._0_4_].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + lVar6 * 4);
        iVar15 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar6];
        if (iVar11 < mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6]) {
          iVar15 = iVar11;
        }
        mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar6] = iVar15;
        iVar11 = *(int *)(*(long *)&pvVar14[(int)_error_msg_._0_4_].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + lVar6 * 4);
        if (iVar11 < maxw.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6]) {
          iVar11 = maxw.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
        }
        maxw.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar6] = iVar11;
      }
    }
  }
  if (valid_opts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      valid_opts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar10 = 0xffffffffffffffff;
  }
  else {
    bVar4 = is_full(this,in_RSI,&maxw);
    if (bVar4) {
      uVar5 = NodeSet::get_index(&this->NS,&mu);
      uVar10 = (ulong)uVar5;
    }
    else {
      lift_state(this,&valid_opts,in_RSI,it,iVar12);
      hash(&key,this,in_RSI);
      this_00 = &this->dp;
      iVar7 = std::
              _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ::find(&this_00->_M_t,&key);
      if ((_Rb_tree_header *)iVar7._M_node == &(this->dp)._M_t._M_impl.super__Rb_tree_header) {
        iVar15 = it + 1;
        iVar11 = (this->inst).nsizes;
        if (iVar15 < iVar11) {
          std::vector<int,_std::allocator<int>_>::vector(&sv,in_RSI);
          sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(this->inst).ndims] = iVar15;
          if ((this->inst).binary == false) {
            sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)(this->inst).ndims + 1] = 0;
          }
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_160,&sv);
          lVar6 = go(this);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_160);
          local_20c = (int)lVar6;
          if (local_20c == -1) {
            snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "up != -1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                     ,0x138);
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,_error_msg_);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          NodeSet::get_label((vector<int,_std::allocator<int>_> *)_error_msg_,&this->NS,local_20c);
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    (&mu,(_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&sv.super__Vector_base<int,_std::allocator<int>_>);
          iVar11 = (this->inst).nsizes;
        }
        else {
          local_20c = -1;
        }
        if ((it < iVar11) &&
           (iVar12 < (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[it])) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)_error_msg_,in_RSI);
          pvVar14 = (this->weights).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + it;
          pIVar2 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = pIVar2[it].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = *(pointer *)
                    ((long)&pIVar2[it].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    + 8);
          do {
            if (piVar8 == piVar3) {
              if ((this->inst).binary == true) {
                *(int *)(CONCAT44(_error_msg_._4_4_,_error_msg_._0_4_) +
                        (long)(this->inst).ndims * 4) = iVar15;
              }
              else {
                lVar13 = (long)(this->inst).ndims;
                lVar6 = CONCAT44(_error_msg_._4_4_,_error_msg_._0_4_);
                if (iVar12 + 1 <
                    (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[it]) {
                  *(int *)(lVar6 + lVar13 * 4) = it;
                  *(int *)(lVar6 + 4 + (long)(this->inst).ndims * 4) = iVar12 + 1;
                }
                else {
                  *(int *)(lVar6 + lVar13 * 4) = iVar15;
                  *(undefined4 *)(lVar6 + 4 + (long)(this->inst).ndims * 4) = 0;
                }
              }
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_178,
                         (vector<int,_std::allocator<int>_> *)_error_msg_);
              lVar6 = go(this);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_178);
              iVar12 = (int)lVar6;
              if (iVar12 != -1) {
                NodeSet::get_label(&sv,&this->NS,iVar12);
                for (lVar6 = 0; lVar13 = (long)(this->inst).ndims, lVar6 < lVar13; lVar6 = lVar6 + 1
                    ) {
                  iVar11 = sv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6] -
                           *(int *)(*(long *)&(pvVar14->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data + lVar6 * 4);
                  if (mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6] <= iVar11) {
                    iVar11 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar6];
                  }
                  mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar6] = iVar11;
                }
                if ((this->inst).binary != false) {
                  iVar11 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13];
                  if (iVar15 < mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar13]) {
                    iVar11 = iVar15;
                  }
                  mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar13] = iVar11;
                }
                iVar11 = NodeSet::get_index(&this->NS,&mu);
                local_144.u = iVar11;
                local_144.v = iVar12;
                local_144.label = it;
                std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
                _M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
                if (iVar11 != local_20c && local_20c != -1) {
                  local_144.label = this->LOSS;
                  local_144.v = local_20c;
                  local_144.u = iVar11;
                  std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>
                  ::_M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&sv.super__Vector_base<int,_std::allocator<int>_>);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
              goto LAB_0010a2fe;
            }
            lVar6 = (long)*piVar8;
            iVar11 = *(int *)(CONCAT44(_error_msg_._4_4_,_error_msg_._0_4_) + lVar6 * 4) +
                     *(int *)(*(long *)&(pvVar14->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + lVar6 * 4);
            *(int *)(CONCAT44(_error_msg_._4_4_,_error_msg_._0_4_) + lVar6 * 4) = iVar11;
            piVar8 = piVar8 + 1;
          } while (iVar11 <= maxw.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar6]);
          uVar5 = NodeSet::get_index(&this->NS,&mu);
          uVar10 = (ulong)uVar5;
          puVar9 = (uint *)std::
                           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                           ::operator[](this_00,&key);
          *puVar9 = uVar5;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
        }
        else {
LAB_0010a2fe:
          uVar5 = NodeSet::get_index(&this->NS,&mu);
          uVar10 = (ulong)uVar5;
          puVar9 = (uint *)std::
                           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                           ::operator[](this_00,&key);
          *puVar9 = uVar5;
        }
      }
      else {
        uVar10 = (ulong)*(uint *)&iVar7._M_node[1]._M_right;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&key.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&maxw.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mu.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&valid_opts.super__Vector_base<int,_std::allocator<int>_>);
  return uVar10 & 0xffffffff;
}

Assistant:

int Arcflow::go(std::vector<int> su) {
	int it = su[inst.ndims];
	int ic = inst.binary ? 0 : su[inst.ndims + 1];
	std::vector<int> valid_opts;
	std::vector<int> mu(max_label);
	std::vector<int> maxw(inst.ndims, 0);
	for (int t = 0; t < inst.nbtypes; t++) {
		if (is_valid(su, inst.Ws[t])) {
			valid_opts.push_back(t);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], inst.Ws[t][d]);
				maxw[d] = std::max(maxw[d], inst.Ws[t][d]);
			}
		}
	}
	if (valid_opts.empty()) {  // if invalid
		return -1;
	} else if (is_full(su, maxw)) {  // if full
		return NS.get_index(mu);
	} else {
		lift_state(valid_opts, su, it, ic);
	}

	// const vector<int> key(su);
	const std::vector<int> key(hash(su));
	std::map<std::vector<int>, int>::iterator itr = dp.find(key);
	if (itr != dp.end()) {
		return itr->second;
	}

	int up = -1;
	if (it + 1 < inst.nsizes) {
		std::vector<int> sv(su);
		sv[inst.ndims] = it + 1;
		if (!inst.binary) {
			sv[inst.ndims + 1] = 0;
		}
		up = go(sv);
		throw_assert(up != -1);
		mu = NS.get_label(up);
	}

	if (it < inst.nsizes && ic < max_rep[it]) {
		std::vector<int> sv(su);
		const std::vector<int> &w = weights[it];
		for (int d : sitems[it].nonzero) {
			sv[d] += w[d];
			if (sv[d] > maxw[d]) {  // if invalid
				return dp[key] = NS.get_index(mu);
			}
		}

		if (inst.binary) {
			sv[inst.ndims] = it + 1;
		} else {
			if (ic + 1 < max_rep[it]) {
				sv[inst.ndims] = it;
				sv[inst.ndims + 1] = ic + 1;
			} else {
				sv[inst.ndims] = it + 1;
				sv[inst.ndims + 1] = 0;
			}
		}

		int iv = go(sv);

		if (iv != -1) {
			const std::vector<int> &v = NS.get_label(iv);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], v[d] - w[d]);
			}
			if (inst.binary) {
				mu[inst.ndims] = std::min(mu[inst.ndims], it + 1);
			}
			int iu = NS.get_index(mu);
			AS.insert(Arc(iu, iv, it));
			if (up != -1 && iu != up) {
				AS.insert(Arc(iu, up, LOSS));
			}
		}
	}

	return dp[key] = NS.get_index(mu);
}